

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterInfo.hpp
# Opt level: O0

void __thiscall helics::FilterInfo::~FilterInfo(FilterInfo *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  vector<helics::EptInformation,_std::allocator<helics::EptInformation>_> *unaff_retaddr;
  
  std::__cxx11::string::~string(in_RDI);
  std::__cxx11::string::~string(in_RDI);
  std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>::~vector
            (unaff_retaddr);
  std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>::~vector
            (unaff_retaddr);
  std::shared_ptr<helics::FilterOperator>::~shared_ptr
            ((shared_ptr<helics::FilterOperator> *)0x6514a3);
  std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::~vector
            ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)unaff_retaddr);
  std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::~vector
            ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)unaff_retaddr);
  std::__cxx11::string::~string(in_RDI);
  std::__cxx11::string::~string(in_RDI);
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

FilterInfo(GlobalBrokerId core_id_,
               InterfaceHandle handle_,
               std::string_view key_,
               std::string_view type_in_,
               std::string_view type_out_,
               bool destFilter_):
        core_id(core_id_), handle(handle_), key(key_), inputType(type_in_), outputType(type_out_),
        dest_filter(destFilter_)
    {
    }